

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aspa.c
# Opt level: O3

void assert_table(rtr_socket *socket,aspa_record *records,size_t record_count)

{
  long lVar1;
  aspa_array *paVar2;
  aspa_record *paVar3;
  size_t sVar4;
  ulong uVar5;
  aspa_store_node *paVar6;
  size_t sVar7;
  size_t sVar8;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (socket->aspa_table == (aspa_table *)0x0) {
    __assert_fail("socket->aspa_table",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                  ,0x106,"void assert_table(struct rtr_socket *, struct aspa_record *, size_t)");
  }
  paVar6 = socket->aspa_table->store;
  if (record_count == 0) {
    for (; paVar6 != (aspa_store_node *)0x0; paVar6 = paVar6->next) {
      if (paVar6->rtr_socket == socket) {
        if (paVar6->aspa_array == (aspa_array *)0x0) {
          __assert_fail("node->aspa_array",
                        "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                        ,0x10e,
                        "void assert_table(struct rtr_socket *, struct aspa_record *, size_t)");
        }
        if (paVar6->aspa_array->size != 0) {
          __assert_fail("node->aspa_array->size == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                        ,0x10f,
                        "void assert_table(struct rtr_socket *, struct aspa_record *, size_t)");
        }
        break;
      }
    }
  }
  else {
    if (paVar6 == (aspa_store_node *)0x0) {
      __assert_fail("socket->aspa_table->store",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                    ,0x11a,"void assert_table(struct rtr_socket *, struct aspa_record *, size_t)");
    }
    paVar2 = paVar6->aspa_array;
    if (paVar2 == (aspa_array *)0x0) {
      __assert_fail("socket->aspa_table->store->aspa_array",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                    ,0x11b,"void assert_table(struct rtr_socket *, struct aspa_record *, size_t)");
    }
    if (paVar6->rtr_socket == (rtr_socket *)0x0) {
      __assert_fail("socket->aspa_table->store->rtr_socket",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                    ,0x11c,"void assert_table(struct rtr_socket *, struct aspa_record *, size_t)");
    }
    if (paVar6->rtr_socket != socket) {
      __assert_fail("socket->aspa_table->store->rtr_socket == socket",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                    ,0x11d,"void assert_table(struct rtr_socket *, struct aspa_record *, size_t)");
    }
    if (paVar6->next != (aspa_store_node *)0x0) {
      __assert_fail("!socket->aspa_table->store->next",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                    ,0x11e,"void assert_table(struct rtr_socket *, struct aspa_record *, size_t)");
    }
    uVar5 = (ulong)paVar2->size;
    if (uVar5 != record_count) {
      printf("error: unexpected number of stored records!");
      uVar5 = (ulong)paVar2->size;
    }
    if (uVar5 != record_count) {
      __assert_fail("array->size == record_count",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                    ,0x125,"void assert_table(struct rtr_socket *, struct aspa_record *, size_t)");
    }
    if (records == (aspa_record *)0x0) {
      __assert_fail("records",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                    ,0x12a,"void assert_table(struct rtr_socket *, struct aspa_record *, size_t)");
    }
    paVar3 = paVar2->data;
    if (paVar3 == (aspa_record *)0x0) {
      __assert_fail("array->data",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                    ,299,"void assert_table(struct rtr_socket *, struct aspa_record *, size_t)");
    }
    sVar7 = 0;
    do {
      if (paVar3[sVar7].customer_asn != records[sVar7].customer_asn) {
        __assert_fail("array->data[i].customer_asn == records[i].customer_asn",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                      ,0x12e,"void assert_table(struct rtr_socket *, struct aspa_record *, size_t)")
        ;
      }
      sVar4 = paVar3[sVar7].provider_count;
      if (sVar4 != records[sVar7].provider_count) {
        __assert_fail("array->data[i].provider_count == records[i].provider_count",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                      ,0x12f,"void assert_table(struct rtr_socket *, struct aspa_record *, size_t)")
        ;
      }
      if (sVar4 != 0) {
        sVar8 = 0;
        do {
          if (paVar3[sVar7].provider_asns[sVar8] != records[sVar7].provider_asns[sVar8]) {
            __assert_fail("array->data[i].provider_asns[k] == records[i].provider_asns[k]",
                          "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                          ,0x132,
                          "void assert_table(struct rtr_socket *, struct aspa_record *, size_t)");
          }
          sVar8 = sVar8 + 1;
        } while (sVar4 != sVar8);
      }
      sVar7 = sVar7 + 1;
    } while (sVar7 != record_count);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void assert_table(struct rtr_socket *socket, struct aspa_record records[], size_t record_count)
{
	assert(socket);
	assert(socket->aspa_table);

	if (record_count == 0) {
		// Assert no data exists for that socket!
		struct aspa_store_node *node = socket->aspa_table->store;

		while (node) {
			if (node->rtr_socket == socket) {
				assert(node->aspa_array);
				assert(node->aspa_array->size == 0);
				return;
			}

			node = node->next;
		}

		return;
	}

	// Assert data exists for that socket...
	assert(socket->aspa_table->store);
	assert(socket->aspa_table->store->aspa_array);
	assert(socket->aspa_table->store->rtr_socket);
	assert(socket->aspa_table->store->rtr_socket == socket);
	assert(!socket->aspa_table->store->next);

	struct aspa_array *array = socket->aspa_table->store->aspa_array;

	if (array->size != record_count)
		printf("error: unexpected number of stored records!");

	assert(array->size == record_count);

	if (record_count <= 0)
		return;

	assert(records);
	assert(array->data);

	for (size_t i = 0; i < record_count; i++) {
		assert(array->data[i].customer_asn == records[i].customer_asn);
		assert(array->data[i].provider_count == records[i].provider_count);

		for (size_t k = 0; k < records[i].provider_count; k++)
			assert(array->data[i].provider_asns[k] == records[i].provider_asns[k]);
	}
}